

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_setRange_success_indexInBoundsRangeBeyondSize_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 3;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x13104f;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"012",4);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x13108c;
  bVar1 = AString_setRange(&string,2,2,'x');
  if (bVar1 == false) {
    pcVar4 = "Assertion \'AString_setRange(&string, 2, 2, \'x\')\' failed";
    iVar2 = 0x4d3;
LAB_001313b6:
    uStack_50 = 0x1313c2;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,pcVar4,0,0);
  }
  uStack_50 = 0x1310a5;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x4d3);
  if (string.capacity != 8) {
    iVar2 = 0x4d4;
LAB_001313f1:
    local_60 = "(8)";
    pcVar9 = "(string).capacity";
    pcVar8 = "(string).capacity == (8)";
    local_58 = (char *)0x8;
    pcVar5 = (char *)string.capacity;
LAB_001314ce:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar6 = &local_60;
    goto LAB_001314d0;
  }
  uStack_50 = 0x1310c5;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x4d4);
  if (string.buffer == (char *)0x0) {
    ppcVar7 = &local_58;
    pcVar5 = "Assertion \'_ck_x != NULL\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
    pcVar8 = "(void*) (string).buffer != NULL";
    pcVar9 = "(void*) (string).buffer";
    iVar2 = 0x4d4;
    goto LAB_0013151b;
  }
  uStack_50 = 0x1310e2;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x4d4);
  pcVar4 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar5 = "";
    pcVar4 = "(null)";
LAB_001312e5:
    local_60 = "01xx";
    pcStack_70 = "(string).buffer == (\"01xx\")";
    pcVar8 = "(string).buffer == (\"01xx\")";
    iVar2 = 0x4d4;
  }
  else {
    uStack_50 = 0x1310ff;
    iVar2 = strcmp("01xx",string.buffer);
    if (iVar2 != 0) {
      pcVar5 = "\"";
      goto LAB_001312e5;
    }
    uStack_50 = 0x131118;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x4d4);
    if (string.size != 4) {
      local_60 = "strlen(\"01xx\")";
      pcVar8 = "(string).size == strlen(\"01xx\")";
      pcVar9 = "(string).size";
      iVar2 = 0x4d4;
      local_58 = (char *)0x4;
      pcVar5 = (char *)string.size;
      goto LAB_001314ce;
    }
    uStack_50 = 0x131138;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x4d4);
    if (private_ACUtilsTest_AString_reallocCount != 0) {
      ppcVar7 = &local_68;
      local_60 = "(0)";
      local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
      pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
      pcVar9 = "private_ACUtilsTest_AString_reallocCount";
      iVar2 = 0x4d5;
LAB_0013151b:
      uStack_50 = 0;
      local_58 = (char *)0x0;
      *(code **)((long)ppcVar7 + -8) =
           test_AString_setRange_success_indexInBoundsRangeBeyondSize_bufferExpanded_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
    }
    uStack_50 = 0x131159;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x4d5);
    uStack_50 = 0x131170;
    bVar1 = AString_setRange(&string,2,4,'y');
    if (bVar1 == false) {
      pcVar4 = "Assertion \'AString_setRange(&string, 2, 4, \'y\')\' failed";
      iVar2 = 0x4d6;
      goto LAB_001313b6;
    }
    uStack_50 = 0x131189;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x4d6);
    if (string.capacity != 8) {
      iVar2 = 0x4d7;
      goto LAB_001313f1;
    }
    uStack_50 = 0x1311a9;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x4d7);
    if (string.buffer == (char *)0x0) {
      ppcVar7 = &local_58;
      pcVar5 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (string).buffer != NULL";
      pcVar9 = "(void*) (string).buffer";
      iVar2 = 0x4d7;
      goto LAB_0013151b;
    }
    uStack_50 = 0x1311c6;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x4d7);
    pcVar4 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar4 = "(null)";
      pcVar5 = "";
    }
    else {
      uStack_50 = 0x1311e3;
      iVar2 = strcmp("01yyyy",string.buffer);
      if (iVar2 == 0) {
        uStack_50 = 0x1311fc;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x4d7);
        if (string.size == 6) {
          uStack_50 = 0x13121c;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x4d7);
          if (private_ACUtilsTest_AString_reallocCount == 0) {
            uStack_50 = 0x13123d;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x4d8);
            uStack_50 = 0x131246;
            (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))(string.buffer);
            return;
          }
          ppcVar7 = &local_68;
          local_60 = "(0)";
          local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
          pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
          pcVar9 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 0x4d8;
          goto LAB_0013151b;
        }
        local_60 = "strlen(\"01yyyy\")";
        pcVar8 = "(string).size == strlen(\"01yyyy\")";
        pcVar9 = "(string).size";
        iVar2 = 0x4d7;
        local_58 = (char *)0x6;
        pcVar5 = (char *)string.size;
        goto LAB_001314ce;
      }
      pcVar5 = "\"";
    }
    local_60 = "01yyyy";
    pcStack_70 = "(string).buffer == (\"01yyyy\")";
    pcVar8 = "(string).buffer == (\"01yyyy\")";
    iVar2 = 0x4d7;
  }
  pcStack_70 = pcStack_70 + 0x13;
  pcVar9 = "(string).buffer";
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_58 = "\"";
  local_68 = "\"";
  ppcVar6 = &pcStack_80;
  pcStack_80 = pcVar4;
  pcStack_78 = pcVar5;
LAB_001314d0:
  uStack_50 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar5;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x1314d7;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar8,pcVar9);
}

Assistant:

END_TEST
START_TEST(test_AString_setRange_success_indexInBoundsRangeBeyondSize)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("012", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_setRange(&string, 2, 2, 'x'));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01xx", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_setRange(&string, 2, 4, 'y'));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01yyyy", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}